

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

pool_ptr<soul::heart::Expression> __thiscall
soul::heart::Parser::parseVariableExpression(Parser *this,FunctionParseState *state)

{
  pointer __s1;
  Expression *pEVar1;
  int iVar2;
  Expression *in_RAX;
  Expression *pEVar3;
  FunctionParseState *in_RDX;
  pool_ptr<soul::heart::Variable> v;
  Expression *local_28;
  
  __s1 = (state->variables).
         super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = in_RAX;
  if (((__s1 == (pointer)"$variableIdentifier") ||
      ((__s1 != (pointer)0x0 && (iVar2 = strcmp((char *)__s1,"$variableIdentifier"), iVar2 == 0))))
     && (findVariable((Parser *)&stack0xffffffffffffffd8,state,(string *)in_RDX), pEVar1 = local_28,
        local_28 != (Expression *)0x0)) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          *)state);
    if (local_28 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    pEVar3 = parseSuffixOperators((Parser *)state,in_RDX,local_28);
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)pEVar3;
    if (pEVar1 != (Expression *)0x0) {
      return (pool_ptr<soul::heart::Expression>)(Expression *)this;
    }
  }
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)0x0;
  return (pool_ptr<soul::heart::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<heart::Expression> parseVariableExpression (const FunctionParseState& state)
    {
        if (matches (Token::variableIdentifier))
        {
            if (auto v = findVariable (state, currentStringValue))
            {
                skip();
                return parseSuffixOperators (state, *v);
            }
        }

        return {};
    }